

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O0

void delete_from_fd(lws_context *context,int fd)

{
  lws **pplVar1;
  bool bVar2;
  lws **done;
  lws **p;
  int fd_local;
  lws_context *context_local;
  
  if ((*(ushort *)&context->field_0x7b7 >> 10 & 1) == 0) {
    if (context->lws_lookup != (lws **)0x0) {
      context->lws_lookup[fd] = (lws *)0x0;
    }
  }
  else {
    done = context->lws_lookup;
    if (done == (lws **)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                    ,0xba,"void delete_from_fd(const struct lws_context *, int)");
    }
    pplVar1 = done + context->max_fds;
    while( true ) {
      bVar2 = false;
      if ((done != pplVar1) && (bVar2 = true, *done != (lws *)0x0)) {
        bVar2 = ((*done)->desc).sockfd != fd;
      }
      if (!bVar2) break;
      done = done + 1;
    }
    if (done != pplVar1) {
      *done = (lws *)0x0;
    }
    done = context->lws_lookup;
    while( true ) {
      bVar2 = false;
      if ((done != pplVar1) && (bVar2 = true, *done != (lws *)0x0)) {
        bVar2 = ((*done)->desc).sockfd != fd;
      }
      if (!bVar2) break;
      done = done + 1;
    }
    if (done != pplVar1) {
      _lws_log(1,"%s: fd %d in lws_lookup again at %d\n","delete_from_fd",(ulong)(uint)fd,
               (long)done - (long)context->lws_lookup >> 3 & 0xffffffff);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                    ,0xce,"void delete_from_fd(const struct lws_context *, int)");
    }
  }
  return;
}

Assistant:

void
delete_from_fd(const struct lws_context *context, int fd)
{

	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit) {
		if (context->lws_lookup)
			context->lws_lookup[fd - lws_plat_socket_offset()] = NULL;

		return;
	}

	/* slow fds handling */

	p = context->lws_lookup;
	assert(p);

	done = &p[context->max_fds];

	/* find the match */

	while (p != done && (!*p || (*p)->desc.sockfd != fd))
		p++;

	if (p != done)
		*p = NULL;

#if defined(_DEBUG)
	p = context->lws_lookup;
	while (p != done && (!*p || (*p)->desc.sockfd != fd))
		p++;

	if (p != done) {
		lwsl_err("%s: fd %d in lws_lookup again at %d\n", __func__,
				fd, (int)(p - context->lws_lookup));
		assert(0);
	}
#endif
}